

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O2

void C_FullConsole(void)

{
  if (demoplayback) {
    G_CheckDemoStatus();
  }
  D_QuitNetGame();
  advancedemo = false;
  ConsoleState = c_down;
  HistPos = (History *)0x0;
  TabbedLast = 0;
  TabbedList = 0;
  if (gamestate == GS_STARTUP) {
    C_AdjustBottom();
    return;
  }
  gamestate = GS_FULLCONSOLE;
  FString::operator=(&level.Music,(char *)"");
  S_Start();
  P_FreeLevelData();
  V_SetBlend(0,0,0,0);
  return;
}

Assistant:

void C_FullConsole ()
{
	if (demoplayback)
		G_CheckDemoStatus ();
	D_QuitNetGame ();
	advancedemo = false;
	ConsoleState = c_down;
	HistPos = NULL;
	TabbedLast = false;
	TabbedList = false;
	if (gamestate != GS_STARTUP)
	{
		gamestate = GS_FULLCONSOLE;
		level.Music = "";
		S_Start ();
		P_FreeLevelData ();
		V_SetBlend (0,0,0,0);
	}
	else
	{
		C_AdjustBottom ();
	}
}